

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetLogfontCharSet(ON_Font *this,uchar logfont_charset)

{
  bool bVar1;
  uchar local_19;
  uchar logfont_charset_local;
  ON_Font *this_local;
  
  local_19 = logfont_charset;
  if (logfont_charset != '\x02') {
    local_19 = '\x01';
  }
  if (local_19 != this->m_logfont_charset) {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2f00);
    if (!bVar1) {
      return false;
    }
    this->m_logfont_charset = local_19;
  }
  return true;
}

Assistant:

bool ON_Font::SetLogfontCharSet(unsigned char logfont_charset)
{
  if (ON_Font::WindowsConstants::logfont_symbol_charset != logfont_charset)
    logfont_charset = ON_Font::WindowsConstants::logfont_default_charset;
  if(logfont_charset != m_logfont_charset)
  {
    if ( false == ON_FONT_MODIFICATION_PERMITTED )
      return false;
    m_logfont_charset = logfont_charset;
  }
  return true;
}